

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_explain.cpp
# Opt level: O1

unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>,_true> __thiscall
duckdb::Transformer::TransformExplain(Transformer *this,PGExplainStmt *stmt)

{
  Value *this_00;
  _Head_base<0UL,_duckdb::ExplainStatement_*,_false> _Var1;
  ExplainFormat explain_format;
  int iVar2;
  pointer pCVar3;
  ExplainStatement *this_01;
  NotImplementedException *this_02;
  InvalidInputException *this_03;
  long in_RDX;
  bool bVar4;
  long *plVar5;
  PGValue val_00;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> def_elem;
  string elem;
  Value val;
  ExplainType local_e4;
  optional_ptr<duckdb::Transformer,_true> local_e0;
  optional_ptr<duckdb_libpgquery::PGDefElem,_true> local_d8;
  PGExplainStmt *local_d0;
  optional_ptr<duckdb_libpgquery::PGValue,_true> local_c8;
  undefined1 local_c0 [32];
  Value local_a0;
  _Head_base<0UL,_duckdb::ExplainStatement_*,_false> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = stmt;
  local_60._M_head_impl = (ExplainStatement *)this;
  if ((*(long *)(in_RDX + 0x10) == 0) ||
     (plVar5 = *(long **)(*(long *)(in_RDX + 0x10) + 8), plVar5 == (long *)0x0)) {
    explain_format = DEFAULT;
    local_e4 = EXPLAIN_STANDARD;
  }
  else {
    bVar4 = false;
    this_00 = (Value *)(local_c0 + 0x20);
    local_e4 = EXPLAIN_STANDARD;
    explain_format = DEFAULT;
    do {
      local_d8.ptr = (PGDefElem *)*plVar5;
      optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_d8);
      ::std::__cxx11::string::string
                ((string *)this_00,(local_d8.ptr)->defname,(allocator *)&local_e0);
      StringUtil::Lower((string *)local_c0,(string *)this_00);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_a0.type_._0_8_ !=
          (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&local_a0.type_.type_info_.internal + 8U)) {
        operator_delete((void *)local_a0.type_._0_8_);
      }
      iVar2 = ::std::__cxx11::string::compare((char *)local_c0);
      if (iVar2 == 0) {
        local_e4 = EXPLAIN_ANALYZE;
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)local_c0);
        if (iVar2 != 0) {
          this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_a0.type_._0_8_ = (long)&local_a0.type_.type_info_.internal + 8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_c0 + 0x20),"Unimplemented explain type: %s","");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_c0._0_8_,
                     (pointer)(local_c0._0_8_ + (long)(_Hash_node_base **)local_c0._8_8_));
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this_02,(string *)(local_c0 + 0x20),&local_50);
          __cxa_throw(this_02,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_d8);
        if ((local_d8.ptr)->arg != (PGNode *)0x0) {
          if (bVar4) {
            this_03 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_a0.type_._0_8_ = (long)&local_a0.type_.type_info_.internal + 8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(local_c0 + 0x20),"FORMAT can not be provided more than once","");
            InvalidInputException::InvalidInputException(this_03,(string *)(local_c0 + 0x20));
            __cxa_throw(this_03,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          optional_ptr<duckdb_libpgquery::PGDefElem,_true>::CheckValid(&local_d8);
          local_c8.ptr = (PGValue *)(local_d8.ptr)->arg;
          optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_c8);
          val_00.val.ival._0_4_ = (local_c8.ptr)->type;
          val_00._0_8_ = local_d0;
          val_00.val.ival._4_4_ = 0;
          TransformValue((Transformer *)&local_e0,val_00);
          pCVar3 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                                 *)&local_e0);
          Value::Value(this_00,&pCVar3->value);
          if (local_e0.ptr != (Transformer *)0x0) {
            (*(code *)(((local_e0.ptr)->parent).ptr)->options)();
          }
          explain_format = ParseFormat(this_00);
          Value::~Value(this_00);
          bVar4 = true;
        }
      }
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_);
      }
      plVar5 = (long *)plVar5[1];
    } while (plVar5 != (long *)0x0);
  }
  TransformStatement((Transformer *)local_c0,(PGNode *)local_d0);
  this_01 = (ExplainStatement *)operator_new(0x88);
  local_a0.type_.id_ = local_c0[0];
  local_a0.type_.physical_type_ = local_c0[1];
  local_a0.type_._2_6_ = local_c0._2_6_;
  local_c0._0_8_ = (long *)0x0;
  ExplainStatement::ExplainStatement
            (this_01,(unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)(local_c0 + 0x20),local_e4,explain_format);
  _Var1._M_head_impl = local_60._M_head_impl;
  ((local_60._M_head_impl)->super_SQLStatement)._vptr_SQLStatement = (_func_int **)this_01;
  if ((long *)local_a0.type_._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a0.type_._0_8_ + 8))();
  }
  if ((long *)local_c0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_c0._0_8_ + 8))();
  }
  return (unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>)
         (unique_ptr<duckdb::ExplainStatement,_std::default_delete<duckdb::ExplainStatement>_>)
         _Var1._M_head_impl;
}

Assistant:

unique_ptr<ExplainStatement> Transformer::TransformExplain(duckdb_libpgquery::PGExplainStmt &stmt) {
	auto explain_type = ExplainType::EXPLAIN_STANDARD;
	auto explain_format = ExplainFormat::DEFAULT;
	bool format_is_set = false;
	if (stmt.options) {
		for (auto n = stmt.options->head; n; n = n->next) {
			auto def_elem = PGPointerCast<duckdb_libpgquery::PGDefElem>(n->data.ptr_value);
			auto def_name = def_elem->defname;
			auto elem = StringUtil::Lower(def_name);
			if (elem == "analyze") {
				explain_type = ExplainType::EXPLAIN_ANALYZE;
			} else if (elem == "format") {
				if (def_elem->arg) {
					if (format_is_set) {
						throw InvalidInputException("FORMAT can not be provided more than once");
					}
					auto val = TransformValue(*PGPointerCast<duckdb_libpgquery::PGValue>(def_elem->arg))->value;
					format_is_set = true;
					explain_format = ParseFormat(val);
				}
			} else {
				throw NotImplementedException("Unimplemented explain type: %s", elem);
			}
		}
	}
	return make_uniq<ExplainStatement>(TransformStatement(*stmt.query), explain_type, explain_format);
}